

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ArgParams * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseParams
          (ArgParams *__return_storage_ptr__,Parser *this,string *element_kind,bool *got_comma,
          Fodder *close_fodder)

{
  pointer pAVar1;
  AST *pAVar2;
  StaticError *this_00;
  pointer this_01;
  Token paren_r;
  string local_108;
  Token local_e8;
  
  (__return_storage_ptr__->
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parseArgs(&local_e8,this,__return_storage_ptr__,element_kind,got_comma);
  this_01 = (__return_storage_ptr__->
            super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (__return_storage_ptr__->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_01 == pAVar1) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(close_fodder,&local_e8.fodder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.location.file._M_dataplus._M_p != &local_e8.location.file.field_2) {
        operator_delete(local_e8.location.file._M_dataplus._M_p,
                        local_e8.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.stringBlockTermIndent._M_dataplus._M_p !=
          &local_e8.stringBlockTermIndent.field_2) {
        operator_delete(local_e8.stringBlockTermIndent._M_dataplus._M_p,
                        local_e8.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.stringBlockIndent._M_dataplus._M_p != &local_e8.stringBlockIndent.field_2) {
        operator_delete(local_e8.stringBlockIndent._M_dataplus._M_p,
                        local_e8.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.data._M_dataplus._M_p != &local_e8.data.field_2) {
        operator_delete(local_e8.data._M_dataplus._M_p,
                        local_e8.data.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_e8.fodder);
      return __return_storage_ptr__;
    }
    if (this_01->id == (Identifier *)0x0) {
      pAVar2 = this_01->expr;
      if (pAVar2->type != AST_VAR) {
        this_00 = (StaticError *)__cxa_allocate_exception(0x60);
        pAVar2 = this_01->expr;
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"could not parse parameter here.","");
        StaticError::StaticError(this_00,&pAVar2->location,&local_108);
        __cxa_throw(this_00,&StaticError::typeinfo,StaticError::~StaticError);
      }
      this_01->id = (Identifier *)pAVar2[1]._vptr_AST;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&this_01->idFodder,&pAVar2->openFodder);
      this_01->expr = (AST *)0x0;
    }
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

ArgParams parseParams(const std::string &element_kind, bool &got_comma, Fodder &close_fodder)
    {
        ArgParams params;
        Token paren_r = parseArgs(params, element_kind, got_comma);

        // Check they're all identifiers
        // parseArgs returns f(x) with x as an expression.  Convert it here.
        for (auto &p : params) {
            if (p.id == nullptr) {
                if (p.expr->type != AST_VAR) {
                    throw StaticError(p.expr->location, "could not parse parameter here.");
                }
                auto *pv = static_cast<Var *>(p.expr);
                p.id = pv->id;
                p.idFodder = pv->openFodder;
                p.expr = nullptr;
            }
        }

        close_fodder = paren_r.fodder;

        return params;
    }